

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_-1,_1,_true>_>,_3,_0>
       ::run(redux_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
             *mat,scalar_sum_op<double,_double> *func)

{
  Index IVar1;
  DenseBase<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
  *m;
  double adVar2 [2];
  CoeffReturnType local_f8;
  long local_f0;
  Index index_3;
  Scalar local_e0;
  Index index_2;
  long local_d0;
  Index index_1;
  double local_b8 [2];
  double local_a8 [3];
  long local_90;
  Index index;
  PacketScalar packet_res1;
  PacketScalar packet_res0;
  result_type local_60;
  Scalar res;
  Index alignedEnd;
  Index alignedEnd2;
  Index alignedSize;
  Index alignedSize2;
  Index alignedStart;
  undefined8 uStack_28;
  int packetAlignment;
  Index packetSize;
  Index size;
  scalar_sum_op<double,_double> *func_local;
  redux_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
  *mat_local;
  
  size = (Index)func;
  func_local = (scalar_sum_op<double,_double> *)mat;
  packetSize = redux_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_-1,_1,_true>_>
               ::size(mat);
  uStack_28 = 2;
  alignedStart._4_4_ = 0x10;
  m = (DenseBase<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
       *)redux_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_-1,_1,_true>_>
         ::nestedExpression((redux_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
                             *)func_local);
  alignedSize2 = first_default_aligned<Eigen::Block<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,_1,1,true>>
                           (m);
  alignedSize = ((packetSize - alignedSize2) / 4) * 4;
  alignedEnd2 = ((packetSize - alignedSize2) / 2) * 2;
  alignedEnd = alignedSize2 + alignedSize;
  res = (Scalar)(alignedSize2 + alignedEnd2);
  if (alignedEnd2 == 0) {
    local_60 = redux_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_-1,_1,_true>_>
               ::coeff((redux_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
                        *)func_local,0);
    for (local_f0 = 1; IVar1 = size, local_f0 < packetSize; local_f0 = local_f0 + 1) {
      local_f8 = redux_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_-1,_1,_true>_>
                 ::coeff((redux_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
                          *)func_local,local_f0);
      local_60 = scalar_sum_op<double,_double>::operator()
                           ((scalar_sum_op<double,_double> *)IVar1,&local_60,&local_f8);
    }
  }
  else {
    adVar2 = redux_evaluator<Eigen::Block<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,-1,1,true>>
             ::packet<0,double__vector(2)>
                       ((redux_evaluator<Eigen::Block<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,_1,1,true>>
                         *)func_local,alignedSize2);
    packet_res1[1] = adVar2[0];
    if (2 < alignedEnd2) {
      adVar2 = redux_evaluator<Eigen::Block<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,-1,1,true>>
               ::packet<0,double__vector(2)>
                         ((redux_evaluator<Eigen::Block<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,_1,1,true>>
                           *)func_local,alignedSize2 + 2);
      index = adVar2[0];
      local_90 = alignedSize2;
      while (IVar1 = size, local_90 = local_90 + 4, local_90 < alignedEnd) {
        adVar2 = redux_evaluator<Eigen::Block<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,-1,1,true>>
                 ::packet<0,double__vector(2)>
                           ((redux_evaluator<Eigen::Block<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,_1,1,true>>
                             *)func_local,local_90);
        local_a8[0] = adVar2[0];
        adVar2 = scalar_sum_op<double,double>::packetOp<double__vector(2)>
                           ((scalar_sum_op<double,double> *)IVar1,(double (*) [2])(packet_res1 + 1),
                            (double (*) [2])local_a8);
        IVar1 = size;
        packet_res1[1] = adVar2[0];
        adVar2 = redux_evaluator<Eigen::Block<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,-1,1,true>>
                 ::packet<0,double__vector(2)>
                           ((redux_evaluator<Eigen::Block<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,_1,1,true>>
                             *)func_local,local_90 + 2);
        local_b8[0] = adVar2[0];
        adVar2 = scalar_sum_op<double,double>::packetOp<double__vector(2)>
                           ((scalar_sum_op<double,double> *)IVar1,(double (*) [2])&index,&local_b8);
        index = adVar2[0];
      }
      adVar2 = scalar_sum_op<double,double>::packetOp<double__vector(2)>
                         ((scalar_sum_op<double,double> *)size,(double (*) [2])(packet_res1 + 1),
                          (double (*) [2])&index);
      IVar1 = size;
      packet_res1[1] = adVar2[0];
      if (alignedEnd < (long)res) {
        adVar2 = redux_evaluator<Eigen::Block<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,-1,1,true>>
                 ::packet<0,double__vector(2)>
                           ((redux_evaluator<Eigen::Block<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,_1,1,true>>
                             *)func_local,alignedEnd);
        index_1 = adVar2[0];
        adVar2 = scalar_sum_op<double,double>::packetOp<double__vector(2)>
                           ((scalar_sum_op<double,double> *)IVar1,(double (*) [2])(packet_res1 + 1),
                            (double (*) [2])&index_1);
        packet_res1[1] = adVar2[0];
      }
    }
    local_60 = scalar_sum_op<double,double>::predux<double__vector(2)>
                         ((scalar_sum_op<double,double> *)size,(double (*) [2])(packet_res1 + 1));
    for (local_d0 = 0; IVar1 = size, local_d0 < alignedSize2; local_d0 = local_d0 + 1) {
      index_2 = (Index)redux_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_-1,_1,_true>_>
                       ::coeff((redux_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
                                *)func_local,local_d0);
      local_60 = scalar_sum_op<double,_double>::operator()
                           ((scalar_sum_op<double,_double> *)IVar1,&local_60,(double *)&index_2);
    }
    for (local_e0 = res; IVar1 = size, (long)local_e0 < packetSize;
        local_e0 = (Scalar)((long)local_e0 + 1)) {
      index_3 = (Index)redux_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_-1,_1,_true>_>
                       ::coeff((redux_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
                                *)func_local,(Index)local_e0);
      local_60 = scalar_sum_op<double,_double>::operator()
                           ((scalar_sum_op<double,_double> *)IVar1,&local_60,(double *)&index_3);
    }
  }
  return local_60;
}

Assistant:

static Scalar run(const Derived &mat, const Func& func)
  {
    const Index size = mat.size();
    
    const Index packetSize = redux_traits<Func, Derived>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Derived::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Derived::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(mat.nestedExpression());
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = mat.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = mat.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, mat.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,mat.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,mat.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = mat.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,mat.coeff(index));
    }

    return res;
  }